

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_access_chain_convert_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::LocalAccessChainConvertPass::ReplaceAccessChainLoad
          (LocalAccessChainConvertPass *this,Instruction *address_inst,Instruction *original_load)

{
  IRContext *this_00;
  Instruction *pIVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  DecorationManager *this_01;
  DebugInfoManager *this_02;
  Operand *pOVar4;
  Instruction *inst;
  bool bVar5;
  initializer_list<unsigned_int> init_list;
  uint32_t local_d4;
  uint32_t varPteTypeId;
  uint32_t varId;
  vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  new_inst;
  Operand local_a8;
  SmallVector<unsigned_int,_2UL> local_70;
  OperandList new_operands;
  
  uVar2 = Instruction::NumInOperands(address_inst);
  if (uVar2 == 1) {
    this_00 = (this->super_MemPass).super_Pass.context_;
    uVar2 = Instruction::result_id(address_inst);
    uVar3 = Instruction::GetSingleWordInOperand(address_inst,0);
    IRContext::ReplaceAllUsesWith(this_00,uVar2,uVar3);
    bVar5 = true;
  }
  else {
    new_inst.
    super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    new_inst.
    super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    new_inst.
    super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar2 = BuildAndAppendVarLoad(this,address_inst,&varId,&varPteTypeId,&new_inst);
    bVar5 = uVar2 != 0;
    if (bVar5) {
      Instruction::UpdateDebugInfoFrom
                (((new_inst.
                   super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,
                 original_load);
      this_01 = IRContext::get_decoration_mgr((this->super_MemPass).super_Pass.context_);
      uVar3 = Instruction::result_id(original_load);
      local_70._vptr_SmallVector._0_4_ = 0;
      local_a8.type = SPV_OPERAND_TYPE_NONE;
      local_a8._4_4_ = 0;
      local_a8.words._vptr_SmallVector = (_func_int **)0x0;
      local_a8.words.size_ = 0;
      std::vector<spv::Decoration,std::allocator<spv::Decoration>>::
      _M_range_initialize<spv::Decoration_const*>
                ((vector<spv::Decoration,std::allocator<spv::Decoration>> *)&local_a8,&local_70);
      analysis::DecorationManager::CloneDecorations
                (this_01,uVar3,uVar2,
                 (vector<spv::Decoration,_std::allocator<spv::Decoration>_> *)&local_a8);
      std::_Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>::~_Vector_base
                ((_Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_> *)&local_a8);
      Instruction::InsertBefore(original_load,&new_inst);
      this_02 = IRContext::get_debug_info_mgr((this->super_MemPass).super_Pass.context_);
      pIVar1 = (original_load->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
      inst = (Instruction *)0x0;
      if ((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false) {
        inst = pIVar1;
      }
      analysis::DebugInfoManager::AnalyzeDebugInst(this_02,inst);
      new_operands.
      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      new_operands.
      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      new_operands.
      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pOVar4 = Instruction::GetOperand(original_load,0);
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      emplace_back<spvtools::opt::Operand&>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                 &new_operands,pOVar4);
      pOVar4 = Instruction::GetOperand(original_load,1);
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      emplace_back<spvtools::opt::Operand&>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                 &new_operands,pOVar4);
      init_list._M_len = 1;
      init_list._M_array = &local_d4;
      local_d4 = uVar2;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_70,init_list);
      local_a8.type = SPV_OPERAND_TYPE_ID;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a8.words,&local_70);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
      emplace_back<spvtools::opt::Operand>
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 &new_operands,&local_a8);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a8.words);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_70);
      AppendConstantOperands
                (this,address_inst,
                 (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 &new_operands);
      original_load->opcode_ = OpCompositeExtract;
      Instruction::ReplaceOperands(original_load,&new_operands);
      IRContext::UpdateDefUse((this->super_MemPass).super_Pass.context_,original_load);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 &new_operands);
    }
    std::
    vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
    ::~vector(&new_inst);
  }
  return bVar5;
}

Assistant:

bool LocalAccessChainConvertPass::ReplaceAccessChainLoad(
    const Instruction* address_inst, Instruction* original_load) {
  // Build and append load of variable in ptrInst
  if (address_inst->NumInOperands() == 1) {
    // An access chain with no indices is essentially a copy.  All that is
    // needed is to propagate the address.
    context()->ReplaceAllUsesWith(
        address_inst->result_id(),
        address_inst->GetSingleWordInOperand(kAccessChainPtrIdInIdx));
    return true;
  }

  std::vector<std::unique_ptr<Instruction>> new_inst;
  uint32_t varId;
  uint32_t varPteTypeId;
  const uint32_t ldResultId =
      BuildAndAppendVarLoad(address_inst, &varId, &varPteTypeId, &new_inst);
  if (ldResultId == 0) {
    return false;
  }

  new_inst[0]->UpdateDebugInfoFrom(original_load);
  context()->get_decoration_mgr()->CloneDecorations(
      original_load->result_id(), ldResultId,
      {spv::Decoration::RelaxedPrecision});
  original_load->InsertBefore(std::move(new_inst));
  context()->get_debug_info_mgr()->AnalyzeDebugInst(
      original_load->PreviousNode());

  // Rewrite |original_load| into an extract.
  Instruction::OperandList new_operands;

  // copy the result id and the type id to the new operand list.
  new_operands.emplace_back(original_load->GetOperand(0));
  new_operands.emplace_back(original_load->GetOperand(1));

  new_operands.emplace_back(
      Operand({spv_operand_type_t::SPV_OPERAND_TYPE_ID, {ldResultId}}));
  AppendConstantOperands(address_inst, &new_operands);
  original_load->SetOpcode(spv::Op::OpCompositeExtract);
  original_load->ReplaceOperands(new_operands);
  context()->UpdateDefUse(original_load);
  return true;
}